

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraCodeLiteGenerator.cxx
# Opt level: O0

string * __thiscall
cmExtraCodeLiteGenerator::GetCodeLiteCompilerName_abi_cxx11_
          (string *__return_storage_ptr__,cmExtraCodeLiteGenerator *this,cmMakefile *mf)

{
  cmGlobalGenerator *this_00;
  bool bVar1;
  char *pcVar2;
  allocator local_a3;
  undefined1 local_a2;
  allocator local_a1;
  undefined1 local_a0 [8];
  string compilerId;
  string local_78;
  allocator local_41;
  undefined1 local_40 [8];
  string compilerIdVar;
  cmMakefile *mf_local;
  cmExtraCodeLiteGenerator *this_local;
  string *compiler;
  
  compilerIdVar.field_2._8_8_ = mf;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_40,"CMAKE_CXX_COMPILER_ID",&local_41);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  this_00 = (this->super_cmExternalMakefileProjectGenerator).GlobalGenerator;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_78,"CXX",(allocator *)(compilerId.field_2._M_local_buf + 0xf));
  bVar1 = cmGlobalGenerator::GetLanguageEnabled(this_00,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::~allocator((allocator<char> *)(compilerId.field_2._M_local_buf + 0xf));
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    std::__cxx11::string::operator=((string *)local_40,"CMAKE_C_COMPILER_ID");
  }
  pcVar2 = cmMakefile::GetSafeDefinition
                     ((cmMakefile *)compilerIdVar.field_2._8_8_,(string *)local_40);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_a0,pcVar2,&local_a1);
  std::allocator<char>::~allocator((allocator<char> *)&local_a1);
  local_a2 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)__return_storage_ptr__,"gnu g++",&local_a3);
  std::allocator<char>::~allocator((allocator<char> *)&local_a3);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_a0,"MSVC");
  if (bVar1) {
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"VC++");
  }
  else {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_a0,"Clang");
    if (bVar1) {
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,"clang++");
    }
    else {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_a0,"GNU");
      if (bVar1) {
        std::__cxx11::string::operator=((string *)__return_storage_ptr__,"gnu g++");
      }
    }
  }
  local_a2 = 1;
  std::__cxx11::string::~string((string *)local_a0);
  std::__cxx11::string::~string((string *)local_40);
  return __return_storage_ptr__;
}

Assistant:

std::string cmExtraCodeLiteGenerator::GetCodeLiteCompilerName(
  const cmMakefile* mf) const
{
  // figure out which language to use
  // for now care only for C and C++
  std::string compilerIdVar = "CMAKE_CXX_COMPILER_ID";
  if (!this->GlobalGenerator->GetLanguageEnabled("CXX")) {
    compilerIdVar = "CMAKE_C_COMPILER_ID";
  }

  std::string compilerId = mf->GetSafeDefinition(compilerIdVar);
  std::string compiler = "gnu g++"; // default to g++

  // Since we need the compiler for parsing purposes only
  // it does not matter if we use clang or clang++, same as
  // "gnu gcc" vs "gnu g++"
  if (compilerId == "MSVC") {
    compiler = "VC++";
  } else if (compilerId == "Clang") {
    compiler = "clang++";
  } else if (compilerId == "GNU") {
    compiler = "gnu g++";
  }
  return compiler;
}